

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range_map.cc
# Opt level: O0

string * __thiscall bloaty::RangeMap::DebugString_abi_cxx11_(RangeMap *this)

{
  bool bVar1;
  AlphaNum *in_RDI;
  const_iterator it;
  string *ret;
  AlphaNum *this_00;
  RangeMap *in_stack_ffffffffffffff70;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>
  in_stack_ffffffffffffff78;
  string local_78 [8];
  AlphaNum *in_stack_ffffffffffffff90;
  AlphaNum *in_stack_ffffffffffffff98;
  Nonnull<std::string_*> in_stack_ffffffffffffffa0;
  _Self local_28;
  _Self local_20;
  undefined1 local_11;
  
  local_11 = 0;
  this_00 = in_RDI;
  std::__cxx11::string::string((string *)in_RDI);
  local_20._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long,_bloaty::RangeMap::Entry,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>_>
       ::begin((map<unsigned_long,_bloaty::RangeMap::Entry,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>_>
                *)in_RDI);
  while( true ) {
    local_28._M_node =
         (_Base_ptr)
         std::
         map<unsigned_long,_bloaty::RangeMap::Entry,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>_>
         ::end((map<unsigned_long,_bloaty::RangeMap::Entry,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>_>
                *)in_RDI);
    bVar1 = std::operator!=(&local_20,&local_28);
    if (!bVar1) break;
    EntryDebugString<std::_Rb_tree_const_iterator<std::pair<unsigned_long_const,bloaty::RangeMap::Entry>>>
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff78);
    absl::AlphaNum::AlphaNum<std::allocator<char>>
              (this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
    absl::AlphaNum::AlphaNum(this_00,(Nullable<const_char_*>)in_RDI);
    absl::StrAppend(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    std::__cxx11::string::~string(local_78);
    std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>::
    operator++((_Rb_tree_const_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_> *)
               this_00);
  }
  return (string *)this_00;
}

Assistant:

std::string RangeMap::DebugString() const {
  std::string ret;
  for (auto it = mappings_.begin(); it != mappings_.end(); ++it) {
    absl::StrAppend(&ret, EntryDebugString(it), "\n");
  }
  return ret;
}